

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_rect_pack.h
# Opt level: O0

void stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp__findresult sVar1;
  bool local_32;
  stbrp__findresult fr;
  int i;
  int num_rects_local;
  stbrp_rect *rects_local;
  stbrp_context *context_local;
  
  for (fr.prev_link._0_4_ = 0; (int)fr.prev_link < num_rects;
      fr.prev_link._0_4_ = (int)fr.prev_link + 1) {
    rects[(int)fr.prev_link].was_packed = (int)fr.prev_link;
  }
  qsort(rects,(long)num_rects,0x10,rect_height_compare);
  for (fr.prev_link._0_4_ = 0; (int)fr.prev_link < num_rects;
      fr.prev_link._0_4_ = (int)fr.prev_link + 1) {
    if ((rects[(int)fr.prev_link].w == 0) || (rects[(int)fr.prev_link].h == 0)) {
      rects[(int)fr.prev_link].y = 0;
      rects[(int)fr.prev_link].x = 0;
    }
    else {
      sVar1 = stbrp__skyline_pack_rectangle
                        (context,(uint)rects[(int)fr.prev_link].w,(uint)rects[(int)fr.prev_link].h);
      fr._0_8_ = sVar1.prev_link;
      if (fr._0_8_ == 0) {
        rects[(int)fr.prev_link].y = 0xffff;
        rects[(int)fr.prev_link].x = 0xffff;
      }
      else {
        rects[(int)fr.prev_link].x = (stbrp_coord)sVar1.x;
        rects[(int)fr.prev_link].y = (stbrp_coord)sVar1.y;
      }
    }
  }
  qsort(rects,(long)num_rects,0x10,rect_original_order);
  for (fr.prev_link._0_4_ = 0; (int)fr.prev_link < num_rects;
      fr.prev_link._0_4_ = (int)fr.prev_link + 1) {
    local_32 = false;
    if (rects[(int)fr.prev_link].x == 0xffff) {
      local_32 = rects[(int)fr.prev_link].y == 0xffff;
    }
    rects[(int)fr.prev_link].was_packed = (uint)((local_32 ^ 0xffU) & 1);
  }
  return;
}

Assistant:

STBRP_DEF void stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
      #ifndef STBRP_LARGE_RECTS
      STBRP_ASSERT(rects[i].w <= 0xffff && rects[i].h <= 0xffff);
      #endif
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags
   for (i=0; i < num_rects; ++i)
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
}